

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LDLt(TPZMatrix<Fad<double>_> *this)

{
  int iVar1;
  bool bVar2;
  Fad<double> *this_00;
  Fad<double> *pFVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RDI;
  Fad<double> val;
  int k_1;
  Fad<double> sum_1;
  int l;
  Fad<double> tmp;
  int k;
  Fad<double> sum;
  int j;
  int dim;
  Fad<double> *in_stack_fffffffffffffd70;
  Fad<double> *in_stack_fffffffffffffd78;
  undefined1 local_270 [8];
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *in_stack_fffffffffffffd98;
  Fad<double> *in_stack_fffffffffffffda0;
  Fad<double> *in_stack_fffffffffffffda8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffffdb8;
  Fad<double> *in_stack_fffffffffffffdc0;
  undefined1 local_230 [32];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [64];
  int local_190;
  undefined4 local_18c;
  int local_164;
  undefined1 local_140 [32];
  undefined1 local_120 [48];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [24];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined1 local_80 [64];
  int local_40;
  undefined4 local_3c;
  int local_18;
  int local_14;
  
  if ((in_RDI->fDecomposed == '\0') || (in_RDI->fDecomposed == '\x04')) {
    if (in_RDI->fDecomposed != '\0') {
      return 4;
    }
  }
  else {
    Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  this_00 = (Fad<double> *)TPZBaseMatrix::Rows(in_RDI);
  pFVar3 = (Fad<double> *)TPZBaseMatrix::Cols(in_RDI);
  if (this_00 != pFVar3) {
    Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  local_14 = (int)iVar4;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_3c = 0;
    Fad<double>::Fad<int,_nullptr>(this_00,(int *)in_stack_fffffffffffffd78);
    for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_80,in_RDI,(long)local_40);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_b0,in_RDI,(long)local_40,(long)local_18);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_d0,in_RDI,(long)local_40,(long)local_18);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0);
      Fad<double>::operator+=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
    }
    in_stack_fffffffffffffd70 = (Fad<double> *)(long)local_18;
    in_stack_fffffffffffffd78 = in_stack_fffffffffffffd70;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_120,in_RDI,in_stack_fffffffffffffd70)
    ;
    operator-<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
              (in_RDI,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,local_f0);
    Fad<double>::~Fad(in_stack_fffffffffffffd70);
    FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
    Fad<double>::~Fad(in_stack_fffffffffffffd70);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_140,in_RDI,(long)local_18);
    Fad<double>::Fad(this_00,in_stack_fffffffffffffd78);
    bVar2 = IsZero<Fad<double>>(in_stack_fffffffffffffd70);
    Fad<double>::~Fad(in_stack_fffffffffffffd70);
    iVar1 = local_18;
    if (bVar2) {
      Error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      iVar1 = local_18;
    }
    while (local_164 = iVar1 + 1, local_164 < local_14) {
      local_18c = 0;
      Fad<double>::Fad<int,_nullptr>(this_00,(int *)in_stack_fffffffffffffd78);
      for (local_190 = 0; local_190 < local_18; local_190 = local_190 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1d0,in_RDI,(long)local_190);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                  (local_1f0,in_RDI,(long)local_18,(long)local_190);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                  (local_210,in_RDI,(long)local_164,(long)local_190);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffda8,
                   in_stack_fffffffffffffda0);
        Fad<double>::operator+=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad(in_stack_fffffffffffffd70);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
        Fad<double>::~Fad(in_stack_fffffffffffffd70);
        Fad<double>::~Fad(in_stack_fffffffffffffd70);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (local_270,in_RDI,(long)local_164,(long)local_18);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      operator/<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda0);
      Fad<double>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,Fad<double>>>
                (in_stack_fffffffffffffdc0,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_fffffffffffffdb8);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffffd70);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_164,(long)local_18,local_230);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18,(long)local_164,local_230);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
      Fad<double>::~Fad(in_stack_fffffffffffffd70);
      iVar1 = local_164;
    }
    Fad<double>::~Fad(in_stack_fffffffffffffd70);
    Fad<double>::~Fad(in_stack_fffffffffffffd70);
  }
  in_RDI->fDecomposed = '\x04';
  in_RDI->fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}